

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O1

char * borg_restock_dynamic(int depth)

{
  int *piVar1;
  int iVar2;
  char *unaff_RBX;
  long lVar3;
  
  if (0 < borg_formulas.restock.count) {
    lVar3 = 0;
    do {
      piVar1 = (int *)borg_formulas.restock.items[lVar3];
      iVar2 = 2;
      if (*piVar1 <= depth) {
        iVar2 = *(int *)(*(char **)(piVar1 + 4) + 4);
        if (**(char **)(piVar1 + 4) == '\x01') {
          iVar2 = borg_calculate_dynamic(iVar2,depth);
        }
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          unaff_RBX = *(char **)(piVar1 + 2);
          iVar2 = 1;
        }
      }
      if (iVar2 != 0) {
        if (iVar2 == 2) {
          return (char *)0x0;
        }
        return unaff_RBX;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < borg_formulas.restock.count);
  }
  return (char *)0x0;
}

Assistant:

const char *borg_restock_dynamic(int depth)
{
    int i;

    for (i = 0; i < borg_formulas.restock.count; i++) {
        struct borg_depth_line *d = borg_formulas.restock.items[i];
        if (d->dlevel > depth)
            break;
        if (check_condition(d->condition, depth))
            return d->reason;
    }

    return NULL;
}